

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2coords.h
# Opt level: O3

void S2::ValidFaceXYZtoUV(int face,S2Point *p,double *pu,double *pv)

{
  VType *pVVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  VType *pVVar5;
  double dVar6;
  S2LogMessage SStack_18;
  
  dVar6 = p->c_[0];
  lVar2 = (long)face * 0x48;
  dVar3 = p->c_[1];
  dVar4 = p->c_[2];
  if (*(double *)(internal::kFaceUVWAxes + lVar2 + 0x40) * dVar4 +
      *(double *)(internal::kFaceUVWAxes + (long)face * 0x48 + 0x30) * dVar6 + 0.0 +
      *(double *)(internal::kFaceUVWAxes + lVar2 + 0x38) * dVar3 <= 0.0) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2coords.h"
               ,0x16d,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (p.DotProd(GetNorm(face))) > (0) ",0x2f);
    abort();
  }
  pVVar1 = p->c_ + 2;
  if ((uint)face < 5) {
    pVVar5 = p->c_ + 1;
    switch(face) {
    case 0:
      *pu = dVar3 / dVar6;
      dVar6 = *pVVar1;
      pVVar5 = p->c_;
      break;
    case 1:
      *pu = -dVar6 / dVar3;
      dVar6 = *pVVar1;
      break;
    case 2:
      *pu = -dVar6 / dVar4;
      dVar6 = *pVVar5;
      goto LAB_001960e6;
    case 3:
      *pu = dVar4 / dVar6;
      dVar6 = *pVVar5;
      pVVar5 = p->c_;
      break;
    case 4:
      *pu = dVar4 / dVar3;
      dVar6 = -p->c_[0];
    }
  }
  else {
    *pu = -dVar3 / dVar4;
    dVar6 = p->c_[0];
LAB_001960e6:
    dVar6 = -dVar6;
    pVVar5 = pVVar1;
  }
  *pv = dVar6 / *pVVar5;
  return;
}

Assistant:

inline S2Point GetUVWAxis(int face, int axis) {
  const double* p = internal::kFaceUVWAxes[face][axis];
  return S2Point(p[0], p[1], p[2]);
}